

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_certificate_verify(ptls_t *tls,ptls_iovec_t message,char *context_string)

{
  code *pcVar1;
  undefined8 uVar2;
  uint8_t *end_00;
  uint8_t *puVar3;
  size_t len;
  uint8_t *p;
  ptls_iovec_t pVar4;
  uint8_t *local_180;
  size_t local_178;
  uint8_t *local_170;
  uint8_t *local_168;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  int ret;
  size_t signdata_size;
  uint8_t signdata [226];
  ptls_iovec_t signature;
  uint16_t algo;
  uint8_t *end;
  uint8_t *src;
  char *context_string_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.base = (uint8_t *)message.len;
  tls_local = (ptls_t *)message.base;
  end = (uint8_t *)((long)&tls_local->ctx + 4);
  end_00 = message_local.base + (long)(&tls_local->traffic_protection + -1) + 0x58;
  src = (uint8_t *)context_string;
  context_string_local = (char *)tls;
  _capacity._4_4_ = ptls_decode16((uint16_t *)((long)&signature.len + 6),&end,end_00);
  if (_capacity._4_4_ == 0) {
    _block_size = 2;
    if ((ulong)((long)end_00 - (long)end) < 2) {
      _capacity._4_4_ = 0x32;
    }
    else {
      end_1 = (uint8_t *)0x0;
      do {
        p = end + 1;
        end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end);
        _block_size = _block_size - 1;
        end = p;
      } while (_block_size != 0);
      if (end_00 + -(long)p < end_1) {
        _capacity._4_4_ = 0x32;
      }
      else {
        puVar3 = p + (long)end_1;
        pVar4 = ptls_iovec_init(p,(long)puVar3 - (long)p);
        local_170 = pVar4.base;
        stack0xffffffffffffffb0 = local_170;
        local_168 = (uint8_t *)pVar4.len;
        signature.base = local_168;
        if (puVar3 == end_00) {
          if ((signature.len._6_2_ == 0x403) || (signature.len._6_2_ == 0x804)) {
            end = puVar3;
            len = build_certificate_verify_signdata
                            ((uint8_t *)&signdata_size,
                             *(ptls_key_schedule_t **)(context_string_local + 0x50),(char *)src);
            if (*(long *)(context_string_local + 0x1f8) == 0) {
              _capacity._4_4_ = 0;
            }
            else {
              pcVar1 = *(code **)(context_string_local + 0x1f8);
              uVar2 = *(undefined8 *)(context_string_local + 0x200);
              pVar4 = ptls_iovec_init(&signdata_size,len);
              local_180 = pVar4.base;
              local_178 = pVar4.len;
              _capacity._4_4_ =
                   (*pcVar1)(uVar2,local_180,local_178,stack0xffffffffffffffb0,signature.base);
            }
            (*ptls_clear_memory)(&signdata_size,len);
            context_string_local[0x1f8] = '\0';
            context_string_local[0x1f9] = '\0';
            context_string_local[0x1fa] = '\0';
            context_string_local[0x1fb] = '\0';
            context_string_local[0x1fc] = '\0';
            context_string_local[0x1fd] = '\0';
            context_string_local[0x1fe] = '\0';
            context_string_local[0x1ff] = '\0';
            if (_capacity._4_4_ == 0) {
              ptls__key_schedule_update_hash
                        (*(ptls_key_schedule_t **)(context_string_local + 0x50),(uint8_t *)tls_local
                         ,(size_t)message_local.base);
            }
          }
          else {
            _capacity._4_4_ = 0x2f;
          }
        }
        else {
          _capacity._4_4_ = 0x32;
        }
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int handle_certificate_verify(ptls_t *tls, ptls_iovec_t message, const char *context_string)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t algo;
    ptls_iovec_t signature;
    uint8_t signdata[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
    size_t signdata_size;
    int ret;

    /* decode */
    if ((ret = ptls_decode16(&algo, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        signature = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* validate */
    switch (algo) {
    case PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256:
    case PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256:
        /* ok */
        break;
    default:
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }
    signdata_size = build_certificate_verify_signdata(signdata, tls->key_schedule, context_string);
    if (tls->certificate_verify.cb != NULL) {
        ret = tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, ptls_iovec_init(signdata, signdata_size), signature);
    } else {
        ret = 0;
    }
    ptls_clear_memory(signdata, signdata_size);
    tls->certificate_verify.cb = NULL;
    if (ret != 0) {
        goto Exit;
    }

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

Exit:
    return ret;
}